

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Matrix *matrix)

{
  vector<double,_std::allocator<double>_> *this;
  const_reference pvVar1;
  ostream *poVar2;
  uint local_20;
  uint local_1c;
  uint j;
  uint i;
  Matrix *matrix_local;
  ostream *out_local;
  
  for (local_1c = 0; local_1c < (matrix->m_shape).field_0.m_dims[0]; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < (matrix->m_shape).field_0.m_dims[1]; local_20 = local_20 + 1) {
      this = Matrix::operator[](matrix,local_1c);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this,(ulong)local_20);
      poVar2 = (ostream *)std::ostream::operator<<(out,*pvVar1);
      std::operator<<(poVar2,"\t");
    }
    std::operator<<(out,'\n');
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Matrix& matrix){
    for(uint i=0;i<matrix.m_shape.n_row;++i){
        for(uint j=0;j<matrix.m_shape.n_col;++j){
            out<<matrix[i][j]<<"\t";
        }   out<<'\n';
    }

    return out;
}